

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hotel.h
# Opt level: O1

void initializeHotel(Hotel *h)

{
  memset(h->booked_rooms,0,0x5d0);
  return;
}

Assistant:

void initializeHotel(Hotel* h){
    for (int i = 0; i < 12; i++) {
        for (int j = 0; j < 31; j++) {
            h->booked_rooms[i][j] = 0;
        }
    }
    return;
}